

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::
call_matcher<std::reference_wrapper<int>&(std::reference_wrapper<int>&),std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>>
::
call_matcher<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>
          (call_matcher<std::reference_wrapper<int>&(std::reference_wrapper<int>&),std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>>
           *this,char *file,unsigned_long line,char *call_string,
          predicate_matcher<trompeloeil::lambdas::equal,_trompeloeil::lambdas::equal_printer,_trompeloeil::typed_matcher<std::reference_wrapper<int>_&>,_int>
          *u)

{
  undefined8 local_30;
  
  *(call_matcher<std::reference_wrapper<int>&(std::reference_wrapper<int>&),std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>>
    **)(this + 8) = this;
  *(call_matcher<std::reference_wrapper<int>&(std::reference_wrapper<int>&),std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>>
    **)(this + 0x10) = this;
  *(char **)(this + 0x18) = file;
  *(unsigned_long *)(this + 0x20) = line;
  *(char **)(this + 0x28) = call_string;
  *(undefined ***)this = &PTR__call_matcher_003cd3e0;
  *(undefined **)(this + 0x30) = &DAT_003cd448;
  *(call_matcher<std::reference_wrapper<int>&(std::reference_wrapper<int>&),std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>>
    **)(this + 0x40) = this + 0x38;
  *(call_matcher<std::reference_wrapper<int>&(std::reference_wrapper<int>&),std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>>
    **)(this + 0x48) = this + 0x38;
  *(undefined ***)(this + 0x38) = &PTR__list_003cd4c8;
  *(call_matcher<std::reference_wrapper<int>&(std::reference_wrapper<int>&),std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>>
    **)(this + 0x58) = this + 0x50;
  *(call_matcher<std::reference_wrapper<int>&(std::reference_wrapper<int>&),std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>>
    **)(this + 0x60) = this + 0x50;
  *(undefined ***)(this + 0x50) = &PTR__list_003cd550;
  *(undefined8 *)(this + 0x68) = 0;
  std::make_unique<trompeloeil::sequence_handler<0ul>>();
  *(undefined8 *)(this + 0x70) = local_30;
  *(int *)(this + 0x78) =
       (u->value).super__Tuple_impl<0UL,_int>.super__Head_base<0UL,_int,_false>._M_head_impl;
  this[0x7c] = (call_matcher<std::reference_wrapper<int>&(std::reference_wrapper<int>&),std::tuple<trompeloeil::predicate_matcher<trompeloeil::lambdas::equal,trompeloeil::lambdas::equal_printer,trompeloeil::typed_matcher<std::reference_wrapper<int>&>,int>>>
                )0x0;
  return;
}

Assistant:

call_matcher(
      char const *file,
      unsigned long line,
      char const *call_string,
      U &&... u)
    : call_matcher_base<Sig>(location{file, line}, call_string)
    , val(std::forward<U>(u)...)
    {}